

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong *puVar12;
  RTCIntersectFunctionN p_Var13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  int mask;
  NodeRef stack [244];
  ulong *local_8d8;
  int local_8cc;
  ulong local_8c8;
  RayQueryContext *local_8c0;
  Ray *local_8b8;
  long local_8b0;
  long local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar29 = ray->tfar, 0.0 <= fVar29)) {
    local_8d8 = local_7d8 + 1;
    fVar47 = (ray->org).field_0.m128[0];
    fVar51 = (ray->org).field_0.m128[1];
    fVar33 = (ray->org).field_0.m128[2];
    fVar30 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar3 = (ray->dir).field_0.field_1;
    auVar19._4_4_ = -(uint)(ABS(aVar3.y) < DAT_01f4bd50._4_4_);
    auVar19._0_4_ = -(uint)(ABS(aVar3.x) < (float)DAT_01f4bd50);
    auVar19._8_4_ = -(uint)(ABS(aVar3.z) < DAT_01f4bd50._8_4_);
    auVar19._12_4_ = -(uint)(ABS(aVar3.field_3.w) < DAT_01f4bd50._12_4_);
    auVar20 = blendvps((undefined1  [16])aVar3,_DAT_01f4bd50,auVar19);
    fVar37 = 0.0;
    if (0.0 <= fVar30) {
      fVar37 = fVar30;
    }
    auVar19 = rcpps(auVar19,auVar20);
    fVar41 = auVar19._0_4_;
    fVar42 = auVar19._4_4_;
    fVar44 = auVar19._8_4_;
    fVar41 = (1.0 - auVar20._0_4_ * fVar41) * fVar41 + fVar41;
    fVar42 = (1.0 - auVar20._4_4_ * fVar42) * fVar42 + fVar42;
    fVar44 = (1.0 - auVar20._8_4_ * fVar44) * fVar44 + fVar44;
    uVar15 = (ulong)(fVar41 < 0.0) << 4;
    uVar18 = (ulong)(fVar42 < 0.0) << 4 | 0x20;
    uVar14 = (ulong)(fVar44 < 0.0) << 4 | 0x40;
    uVar17 = uVar15 ^ 0x10;
    fStack_7dc = fVar29;
    fVar30 = fVar29;
    fVar31 = fVar29;
    fVar32 = fVar29;
    fVar34 = fVar33;
    fVar35 = fVar33;
    fVar36 = fVar33;
    fVar38 = fVar37;
    fVar39 = fVar37;
    fVar40 = fVar37;
    fVar43 = fVar44;
    fVar45 = fVar44;
    fVar46 = fVar44;
    fVar48 = fVar47;
    fVar49 = fVar47;
    fVar50 = fVar47;
    fVar52 = fVar51;
    fVar53 = fVar51;
    fVar54 = fVar51;
    fVar55 = fVar41;
    fVar56 = fVar41;
    fVar57 = fVar41;
    fVar58 = fVar42;
    fVar59 = fVar42;
    fVar60 = fVar42;
    local_8c8 = uVar15;
    local_8c0 = context;
    local_8b8 = ray;
    local_858 = fVar42;
    fStack_854 = fVar42;
    fStack_850 = fVar42;
    fStack_84c = fVar42;
    local_848 = fVar41;
    fStack_844 = fVar41;
    fStack_840 = fVar41;
    fStack_83c = fVar41;
    local_838 = fVar51;
    fStack_834 = fVar51;
    fStack_830 = fVar51;
    fStack_82c = fVar51;
    local_828 = fVar47;
    fStack_824 = fVar47;
    fStack_820 = fVar47;
    fStack_81c = fVar47;
    local_818 = fVar44;
    fStack_814 = fVar44;
    fStack_810 = fVar44;
    fStack_80c = fVar44;
    local_808 = fVar37;
    fStack_804 = fVar37;
    fStack_800 = fVar37;
    fStack_7fc = fVar37;
    local_7f8 = fVar33;
    fStack_7f4 = fVar33;
    fStack_7f0 = fVar33;
    fStack_7ec = fVar33;
    local_7e8 = fVar29;
    fStack_7e4 = fVar29;
    fStack_7e0 = fVar29;
LAB_006a74ef:
    puVar12 = local_7d8;
    if (local_8d8 != puVar12) {
      uVar16 = local_8d8[-1];
      local_8d8 = local_8d8 + -1;
LAB_006a750c:
      fVar9 = (ray->dir).field_0.m128[3];
      while ((uVar16 & 8) == 0) {
        uVar10 = uVar16 & 0xfffffffffffffff0;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar15);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar15);
        auVar22._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar47) * fVar41;
        auVar22._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar48) * fVar55;
        auVar22._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar49) * fVar56;
        auVar22._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar50) * fVar57;
        auVar25._4_4_ = fVar38;
        auVar25._0_4_ = fVar37;
        auVar25._8_4_ = fVar39;
        auVar25._12_4_ = fVar40;
        auVar19 = maxps(auVar25,auVar22);
        pfVar2 = (float *)(uVar10 + 0x80 + uVar18);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar18);
        auVar23._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar51) * fVar42;
        auVar23._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar52) * fVar58;
        auVar23._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar53) * fVar59;
        auVar23._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar54) * fVar60;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar14);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
        auVar26._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar33) * fVar44;
        auVar26._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar34) * fVar43;
        auVar26._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar35) * fVar45;
        auVar26._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar36) * fVar46;
        auVar20 = maxps(auVar23,auVar26);
        auVar19 = maxps(auVar19,auVar20);
        pfVar2 = (float *)(uVar10 + 0x80 + uVar17);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar17);
        auVar27._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar47) * fVar41;
        auVar27._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar48) * fVar55;
        auVar27._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar49) * fVar56;
        auVar27._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar50) * fVar57;
        auVar24._4_4_ = fVar30;
        auVar24._0_4_ = fVar29;
        auVar24._8_4_ = fVar31;
        auVar24._12_4_ = fVar32;
        auVar25 = minps(auVar24,auVar27);
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar18 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar18 ^ 0x10));
        auVar28._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar51) * fVar42;
        auVar28._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar52) * fVar58;
        auVar28._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar53) * fVar59;
        auVar28._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar54) * fVar60;
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar14 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar14 ^ 0x10));
        auVar20._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar34) * fVar43;
        auVar20._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar33) * fVar44;
        auVar20._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar35) * fVar45;
        auVar20._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar36) * fVar46;
        auVar20 = minps(auVar28,auVar20);
        auVar20 = minps(auVar25,auVar20);
        bVar5 = auVar19._0_4_ <= auVar20._0_4_;
        bVar6 = auVar19._4_4_ <= auVar20._4_4_;
        bVar7 = auVar19._8_4_ <= auVar20._8_4_;
        bVar8 = auVar19._12_4_ <= auVar20._12_4_;
        if (((uint)uVar16 & 7) == 6) {
          bVar5 = (fVar9 < *(float *)(uVar10 + 0xf0) && *(float *)(uVar10 + 0xe0) <= fVar9) && bVar5
          ;
          bVar6 = (fVar9 < *(float *)(uVar10 + 0xf4) && *(float *)(uVar10 + 0xe4) <= fVar9) && bVar6
          ;
          bVar7 = (fVar9 < *(float *)(uVar10 + 0xf8) && *(float *)(uVar10 + 0xe8) <= fVar9) && bVar7
          ;
          bVar8 = (fVar9 < *(float *)(uVar10 + 0xfc) && *(float *)(uVar10 + 0xec) <= fVar9) && bVar8
          ;
        }
        auVar21._0_4_ = (uint)bVar5 * -0x80000000;
        auVar21._4_4_ = (uint)bVar6 * -0x80000000;
        auVar21._8_4_ = (uint)bVar7 * -0x80000000;
        auVar21._12_4_ = (uint)bVar8 * -0x80000000;
        uVar11 = movmskps((int)puVar12,auVar21);
        if (uVar11 == 0) goto LAB_006a74ef;
        uVar11 = uVar11 & 0xff;
        lVar4 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar16 = *(ulong *)(uVar10 + lVar4 * 8);
        uVar11 = uVar11 - 1 & uVar11;
        puVar12 = (ulong *)(ulong)uVar11;
        if (uVar11 != 0) goto LAB_006a7647;
      }
      local_8b0 = (ulong)((uint)uVar16 & 0xf) - 8;
      for (local_8a8 = 0; local_8b0 != local_8a8; local_8a8 = local_8a8 + 1) {
        local_8a0.geomID = *(uint *)((uVar16 & 0xfffffffffffffff0) + local_8a8 * 8);
        local_870 = (context->scene->geometries).items[local_8a0.geomID].ptr;
        if ((ray->mask & local_870->mask) != 0) {
          local_8a0.primID = *(uint *)((uVar16 & 0xfffffffffffffff0) + 4 + local_8a8 * 8);
          local_8cc = -1;
          local_8a0.valid = &local_8cc;
          local_8a0.geometryUserPtr = local_870->userPtr;
          local_8a0.context = context->user;
          local_8a0.N = 1;
          local_868 = 0;
          local_860 = context->args;
          p_Var13 = local_860->intersect;
          if (p_Var13 == (RTCIntersectFunctionN)0x0) {
            p_Var13 = (RTCIntersectFunctionN)
                      local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
            ;
          }
          local_8a0.rayhit = (RTCRayHitN *)ray;
          (*p_Var13)(&local_8a0);
          context = local_8c0;
          ray = local_8b8;
          uVar15 = local_8c8;
          fVar29 = local_7e8;
          fVar30 = fStack_7e4;
          fVar31 = fStack_7e0;
          fVar32 = fStack_7dc;
          fVar33 = local_7f8;
          fVar34 = fStack_7f4;
          fVar35 = fStack_7f0;
          fVar36 = fStack_7ec;
          fVar37 = local_808;
          fVar38 = fStack_804;
          fVar39 = fStack_800;
          fVar40 = fStack_7fc;
          fVar44 = local_818;
          fVar43 = fStack_814;
          fVar45 = fStack_810;
          fVar46 = fStack_80c;
          fVar47 = local_828;
          fVar48 = fStack_824;
          fVar49 = fStack_820;
          fVar50 = fStack_81c;
          fVar51 = local_838;
          fVar52 = fStack_834;
          fVar53 = fStack_830;
          fVar54 = fStack_82c;
          fVar41 = local_848;
          fVar55 = fStack_844;
          fVar56 = fStack_840;
          fVar57 = fStack_83c;
          fVar42 = local_858;
          fVar58 = fStack_854;
          fVar59 = fStack_850;
          fVar60 = fStack_84c;
          if (local_8b8->tfar <= 0.0 && local_8b8->tfar != 0.0) {
            local_8b8->tfar = -INFINITY;
            return;
          }
        }
      }
      goto LAB_006a74ef;
    }
  }
  return;
LAB_006a7647:
  do {
    *local_8d8 = uVar16;
    local_8d8 = local_8d8 + 1;
    lVar4 = 0;
    if (puVar12 != (ulong *)0x0) {
      for (; ((ulong)puVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    uVar16 = *(ulong *)(uVar10 + lVar4 * 8);
    puVar12 = (ulong *)((long)puVar12 - 1U & (ulong)puVar12);
  } while (puVar12 != (ulong *)0x0);
  goto LAB_006a750c;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }